

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

bool lest::is_number(text *arg)

{
  long lVar1;
  bool bVar2;
  text digits;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"0123456789","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)local_58,local_38,local_38 + local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  lVar1 = std::__cxx11::string::find_first_of((char *)arg,(ulong)local_58[0],0);
  if (lVar1 == -1) {
    bVar2 = false;
  }
  else {
    lVar1 = std::__cxx11::string::find_first_not_of((char *)arg,(ulong)local_58[0],0);
    bVar2 = lVar1 == -1;
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return bVar2;
}

Assistant:

inline bool is_number( text arg )
{
    const text digits = "0123456789";
    return text::npos != arg.find_first_of    ( digits )
        && text::npos == arg.find_first_not_of( digits );
}